

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.h
# Opt level: O1

void __thiscall SchemePrimitiveProcedure::~SchemePrimitiveProcedure(SchemePrimitiveProcedure *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_SchemeProcedure).super_SchemeObject._vptr_SchemeObject =
       (_func_int **)&PTR__SchemeProcedure_0016bd68;
  pcVar2 = (this->super_SchemeProcedure).name._M_dataplus._M_p;
  paVar1 = &(this->super_SchemeProcedure).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x38);
  return;
}

Assistant:

SchemePrimitiveProcedure(const std::string &name_, long long minargs, long long maxargs)
    {
        name = name_;
        arity.first = minargs;
        arity.second = maxargs;
    }